

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O0

int __thiscall Fl_Slider::handle(Fl_Slider *this,int event)

{
  int iVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int event_local;
  Fl_Slider *this_local;
  
  if (event == 1) {
    iVar1 = Fl::visible_focus();
    if (iVar1 != 0) {
      Fl::focus((Fl_Widget *)this);
      Fl_Widget::redraw((Fl_Widget *)this);
    }
  }
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar3 = Fl::box_dx(FVar2);
  iVar4 = Fl_Widget::y((Fl_Widget *)this);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dy(FVar2);
  iVar6 = Fl_Widget::w((Fl_Widget *)this);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar7 = Fl::box_dw(FVar2);
  iVar8 = Fl_Widget::h((Fl_Widget *)this);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar9 = Fl::box_dh(FVar2);
  iVar1 = handle(this,event,iVar1 + iVar3,iVar4 + iVar5,iVar6 - iVar7,iVar8 - iVar9);
  return iVar1;
}

Assistant:

int Fl_Slider::handle(int event) {
  if (event == FL_PUSH && Fl::visible_focus()) {
    Fl::focus(this);
    redraw();
  }

  return handle(event,
		x()+Fl::box_dx(box()),
		y()+Fl::box_dy(box()),
		w()-Fl::box_dw(box()),
		h()-Fl::box_dh(box()));
}